

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildReg2
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot R0,RegSlot R1,uint32 nextOffset)

{
  code *pcVar1;
  StackSym *this_00;
  bool bVar2;
  RegSlot RVar3;
  uint sourceContextId;
  uint functionId;
  BailOutKind BVar4;
  RegOpnd *pRVar5;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar6;
  Instr *pIVar7;
  GeneratorBailInInstr *label;
  BailOutInfo *pBVar8;
  LabelInstr *instr_00;
  Instr *resumeYield;
  Instr *traceBailIn;
  LabelInstr *traceBailInLabel;
  GeneratorBailInInstr *bailInLabel;
  Instr *yieldInstr;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_88;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_86;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_84;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_82;
  Instr *local_80;
  Instr *instr;
  StackSym *dstSym;
  RegOpnd *dstOpnd;
  RegOpnd *src2Opnd;
  Instr *pIStack_58;
  RegSlot envReg;
  Instr *instr_2;
  RegOpnd *dstOpnd_1;
  Instr *instr_1;
  StackSym *pSStack_38;
  bool reuseLoc;
  StackSym *symSrc1;
  RegOpnd *src1Opnd;
  RegSlot local_20;
  uint32 nextOffset_local;
  RegSlot R1_local;
  RegSlot R0_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  src1Opnd._4_4_ = nextOffset;
  local_20 = R1;
  nextOffset_local = R0;
  R1_local = offset;
  R0_local._2_2_ = newOpcode;
  _offset_local = this;
  symSrc1 = (StackSym *)BuildSrcOpnd(this,R1,TyVar);
  pSStack_38 = *(StackSym **)&(symSrc1->super_Sym).m_id;
  instr_1._7_1_ = false;
  if (R0_local._2_2_ == Ld_A_ReuseLoc) {
    R0_local._2_2_ = Ld_A;
    instr_1._7_1_ = true;
  }
  else {
    if (R0_local._2_2_ == LdFuncExprFrameDisplay) {
      instr_2 = (Instr *)IR::RegOpnd::New(TyVar,this->m_func);
      pIStack_58 = IR::Instr::New(LdFrameDisplay,(Opnd *)instr_2,(Opnd *)symSrc1,this->m_func);
      src2Opnd._4_4_ = GetEnvReg(this);
      pIVar7 = pIStack_58;
      if (src2Opnd._4_4_ != 0xffffffff) {
        pRVar5 = BuildSrcOpnd(this,src2Opnd._4_4_,TyVar);
        IR::Instr::SetSrc2(pIVar7,&pRVar5->super_Opnd);
      }
      AddInstr(this,pIStack_58,R1_local);
      dstOpnd = (RegOpnd *)instr_2;
      symSrc1 = (StackSym *)BuildSrcOpnd(this,nextOffset_local,TyVar);
      this_01 = Func::GetJITFunctionBody(this->m_func);
      RVar3 = JITTimeFunctionBody::GetLocalFrameDisplayReg(this_01);
      instr_2 = (Instr *)BuildDstOpnd(this,RVar3,TyVar,false,false);
      pIStack_58 = IR::Instr::New(LdFrameDisplay,(Opnd *)instr_2,(Opnd *)symSrc1,
                                  &dstOpnd->super_Opnd,this->m_func);
      *(uint *)&instr_2->m_next->m_prev = *(uint *)&instr_2->m_next->m_prev & 0xfffffffd | 2;
      AddInstr(this,pIStack_58,R1_local);
      return;
    }
    if (R0_local._2_2_ == Typeof_ReuseLoc) {
      R0_local._2_2_ = Typeof;
      instr_1._7_1_ = true;
    }
    else if (R0_local._2_2_ == UnwrapWithObj_ReuseLoc) {
      R0_local._2_2_ = UnwrapWithObj;
      instr_1._7_1_ = true;
    }
    else if ((R0_local._2_2_ == SetComputedNameVar) || (R0_local._2_2_ == SpreadObjectLiteral)) {
      pIVar7 = IR::Instr::New(R0_local._2_2_,this->m_func);
      dstOpnd_1 = (RegOpnd *)pIVar7;
      pRVar5 = BuildSrcOpnd(this,nextOffset_local,TyVar);
      IR::Instr::SetSrc1(pIVar7,&pRVar5->super_Opnd);
      IR::Instr::SetSrc2((Instr *)dstOpnd_1,(Opnd *)symSrc1);
      AddInstr(this,(Instr *)dstOpnd_1,R1_local);
      return;
    }
  }
  dstSym = (StackSym *)BuildDstOpnd(this,nextOffset_local,TyVar,false,(bool)instr_1._7_1_);
  this_00 = symSrc1;
  instr = *(Instr **)&(dstSym->super_Sym).m_id;
  local_80 = (Instr *)0x0;
  if (R0_local._2_2_ == BeginSwitch) {
    SwitchIRBuilder::BeginSwitch(&this->m_switchBuilder);
    R0_local._2_2_ = Ld_A;
  }
  else {
    if (R0_local._2_2_ == Yield) {
      bVar2 = IsLoopBody(this);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x75c,"(!this->IsLoopBody())",
                           "Attempting to JIT loop body containing Yield");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_80 = IR::Instr::New(R0_local._2_2_,(Opnd *)dstSym,(Opnd *)symSrc1,this->m_func);
      AddInstr(this,local_80,R1_local);
      pIVar7 = IR::Instr::ConvertToBailOutInstr
                         (local_80,local_80,BailOutForGeneratorYield,0xffffffff);
      this->m_lastInstr = pIVar7;
      label = IR::GeneratorBailInInstr::New(pIVar7,this->m_func);
      (label->super_LabelInstr).field_0x78 = (label->super_LabelInstr).field_0x78 & 0xfb | 4;
      (label->super_LabelInstr).m_name = L"GeneratorBailInLabel";
      AddInstr(this,(Instr *)label,R1_local);
      Func::AddYieldOffsetResumeLabel(this->m_func,src1Opnd._4_4_,&label->super_LabelInstr);
      pBVar8 = IR::Instr::GetBailOutInfo(pIVar7);
      pBVar8->bailInInstr = label;
      sourceContextId = Func::GetSourceContextId(this->m_func);
      functionId = Func::GetLocalFunctionId(this->m_func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailInPhase,sourceContextId,functionId);
      if (bVar2) {
        instr_00 = IR::LabelInstr::New(GeneratorOutputBailInTraceLabel,this->m_func,false);
        instr_00->field_0x78 = instr_00->field_0x78 & 0xfb | 4;
        instr_00->m_name = L"OutputBailInTrace";
        AddInstr(this,&instr_00->super_Instr,R1_local);
        pIVar7 = IR::Instr::New(GeneratorOutputBailInTrace,this->m_func);
        AddInstr(this,pIVar7,R1_local);
      }
      pIVar7 = IR::Instr::New(GeneratorResumeYield,(Opnd *)dstSym,this->m_func);
      AddInstr(this,pIVar7,R1_local);
      bVar2 = Func::IsJitInDebugMode(this->m_func);
      RVar3 = R1_local;
      if (!bVar2) {
        return;
      }
      BVar4 = IR::operator|(BailOutForceByFlag,BailOutBreakPointInFunction);
      BVar4 = IR::operator|(BVar4,BailOutStep);
      InsertBailOutForDebugger(this,RVar3,BVar4,(Instr *)0x0);
      return;
    }
    if (R0_local._2_2_ == Ld_A) {
      bVar2 = Js::BuiltinFunction::operator!=(&pSStack_38->m_builtInIndex,None);
      if (bVar2) {
        *(byte *)((long)&instr->m_prev + 5) = (pSStack_38->m_builtInIndex)._value;
      }
    }
    else if (R0_local._2_2_ == Delete_A) {
      local_82 = ValueType::Boolean.field_0;
      IR::Opnd::SetValueType((Opnd *)dstSym,ValueType::Boolean);
    }
    else if (R0_local._2_2_ == LdArrHead) {
      local_88.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Array);
      local_86.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetHasNoMissingValues((ValueType *)&local_88.field_0,false);
      local_84.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetArrayTypeId((ValueType *)&local_86.field_0,TypeIds_Array);
      IR::Opnd::SetValueType((Opnd *)this_00,(ValueType)local_84.field_0);
      IR::Opnd::SetValueTypeFixed((Opnd *)symSrc1);
    }
    else {
      if (R0_local._2_2_ == LdInnerFrameDisplayNoParent) {
        local_80 = IR::Instr::New(LdInnerFrameDisplay,(Opnd *)dstSym,(Opnd *)symSrc1,this->m_func);
        AddEnvOpndForInnerFrameDisplay(this,local_80,R1_local);
        if (((ulong)instr->m_prev & 1) != 0) {
          *(uint *)&instr->m_prev = *(uint *)&instr->m_prev & 0xfffffffd | 2;
        }
        AddInstr(this,local_80,R1_local);
        return;
      }
      if (R0_local._2_2_ == Conv_Str) {
        IR::Opnd::SetValueType((Opnd *)dstSym,ValueType::String);
      }
    }
  }
  if (local_80 == (Instr *)0x0) {
    local_80 = IR::Instr::New(R0_local._2_2_,(Opnd *)dstSym,(Opnd *)symSrc1,this->m_func);
  }
  AddInstr(this,local_80,R1_local);
  return;
}

Assistant:

void
IRBuilder::BuildReg2(Js::OpCode newOpcode, uint32 offset, Js::RegSlot R0, Js::RegSlot R1, uint32 nextOffset)
{
    IR::RegOpnd *   src1Opnd = this->BuildSrcOpnd(R1);
    StackSym *      symSrc1 = src1Opnd->m_sym;
    bool            reuseLoc = false;

    switch (newOpcode)
    {
    case Js::OpCode::Ld_A_ReuseLoc:
        newOpcode = Js::OpCode::Ld_A;
        reuseLoc = true;
        break;

    case Js::OpCode::Typeof_ReuseLoc:
        newOpcode = Js::OpCode::Typeof;
        reuseLoc = true;
        break;

    case Js::OpCode::UnwrapWithObj_ReuseLoc:
        newOpcode = Js::OpCode::UnwrapWithObj;
        reuseLoc = true;
        break;

    case Js::OpCode::SpreadObjectLiteral:
        // fall through
    case Js::OpCode::SetComputedNameVar:
    {
        IR::Instr *instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(this->BuildSrcOpnd(R0));
        instr->SetSrc2(src1Opnd);
        this->AddInstr(instr, offset);
        return;
    }
    case Js::OpCode::LdFuncExprFrameDisplay:
    {
        IR::RegOpnd *dstOpnd = IR::RegOpnd::New(TyVar, m_func);
        IR::Instr *instr = IR::Instr::New(Js::OpCode::LdFrameDisplay, dstOpnd, src1Opnd, m_func);
        Js::RegSlot envReg = this->GetEnvReg();
        if (envReg != Js::Constants::NoRegister)
        {
            instr->SetSrc2(BuildSrcOpnd(envReg));
        }
        this->AddInstr(instr, offset);

        IR::RegOpnd *src2Opnd = dstOpnd;
        src1Opnd = BuildSrcOpnd(R0);
        dstOpnd = BuildDstOpnd(m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg());
        instr = IR::Instr::New(Js::OpCode::LdFrameDisplay, dstOpnd, src1Opnd, src2Opnd, m_func);
        dstOpnd->m_sym->m_isNotNumber = true;
        this->AddInstr(instr, offset);
        return;
    }
    }

    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(R0, TyVar, false, reuseLoc);
    StackSym *      dstSym = dstOpnd->m_sym;

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCode::Ld_A:
        if (symSrc1->m_builtInIndex != Js::BuiltinFunction::None)
        {
            // Note: don't set dstSym->m_builtInIndex to None here (see Win8 399972)
            dstSym->m_builtInIndex = symSrc1->m_builtInIndex;
        }
        break;

    case Js::OpCode::Delete_A:
        dstOpnd->SetValueType(ValueType::Boolean);
        break;
    case Js::OpCode::BeginSwitch:
        m_switchBuilder.BeginSwitch();
        newOpcode = Js::OpCode::Ld_A;
        break;
    case Js::OpCode::LdArrHead:
        src1Opnd->SetValueType(
            ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
        src1Opnd->SetValueTypeFixed();
        break;

    case Js::OpCode::LdInnerFrameDisplayNoParent:
    {
        instr = IR::Instr::New(Js::OpCode::LdInnerFrameDisplay, dstOpnd, src1Opnd, m_func);
        this->AddEnvOpndForInnerFrameDisplay(instr, offset);
        if (dstSym->m_isSingleDef)
        {
            dstSym->m_isNotNumber = true;
        }
        this->AddInstr(instr, offset);

        return;
    }

    case Js::OpCode::Conv_Str:
        dstOpnd->SetValueType(ValueType::String);
        break;

    case Js::OpCode::Yield:
        // Jitting Loop Bodies containing Yield is not possible, blocked at callsites of GenerateLoopBody
        AssertMsg(!this->IsLoopBody(), "Attempting to JIT loop body containing Yield");

        instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, m_func);
        this->AddInstr(instr, offset);
        IR::Instr* yieldInstr = instr->ConvertToBailOutInstr(instr, IR::BailOutForGeneratorYield);
        this->m_lastInstr = yieldInstr;

        // This label indicates the bail-in section that we will jump to from the generator jump table
        auto* bailInLabel = IR::GeneratorBailInInstr::New(yieldInstr, m_func);
        bailInLabel->m_hasNonBranchRef = true;              // set to true so that we don't move this label around
        LABELNAMESET(bailInLabel, "GeneratorBailInLabel");
        this->AddInstr(bailInLabel, offset);
        this->m_func->AddYieldOffsetResumeLabel(nextOffset, bailInLabel);

        yieldInstr->GetBailOutInfo()->bailInInstr = bailInLabel;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_TRACE(Js::Phase::BailInPhase, this->m_func))
        {
            IR::LabelInstr* traceBailInLabel = IR::LabelInstr::New(Js::OpCode::GeneratorOutputBailInTraceLabel, m_func);
            traceBailInLabel->m_hasNonBranchRef = true;     // set to true so that we don't move this label around
            LABELNAMESET(traceBailInLabel, "OutputBailInTrace");
            this->AddInstr(traceBailInLabel, offset);

            IR::Instr* traceBailIn = IR::Instr::New(Js::OpCode::GeneratorOutputBailInTrace, m_func);
            this->AddInstr(traceBailIn, offset);
        }
#endif

        IR::Instr* resumeYield = IR::Instr::New(Js::OpCode::GeneratorResumeYield, dstOpnd, m_func);
        this->AddInstr(resumeYield, offset);

        if (this->m_func->IsJitInDebugMode())
        {
            this->InsertBailOutForDebugger(offset, IR::BailOutForceByFlag | IR::BailOutBreakPointInFunction | IR::BailOutStep);
        }

        return;
    }

    if (instr == nullptr)
    {
        instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, m_func);
    }

    this->AddInstr(instr, offset);
}